

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_restart_init_enc(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  mqc->curctx = mqc->ctxs;
  mqc->a = 0x8000;
  mqc->c = 0;
  mqc->ct = 0xc;
  mqc->bp = mqc->bp + -1;
  if (*mqc->bp == 0xff) {
    mqc->ct = 0xd;
  }
  return;
}

Assistant:

void mqc_restart_init_enc(opj_mqc_t *mqc) {
	/* <Re-init part> */
	mqc_setcurctx(mqc, 0);
	mqc->a = 0x8000;
	mqc->c = 0;
	mqc->ct = 12;
	mqc->bp--;
	if (*mqc->bp == 0xff) {
		mqc->ct = 13;
	}
}